

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_sasl_mechanisms(AMQP_VALUE value,SASL_MECHANISMS_HANDLE *sasl_mechanisms_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_50;
  AMQP_VALUE sasl_server_mechanisms_array;
  char *sasl_server_mechanisms;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  SASL_MECHANISMS_INSTANCE *sasl_mechanisms_instance;
  SASL_MECHANISMS_HANDLE *ppSStack_18;
  int result;
  SASL_MECHANISMS_HANDLE *sasl_mechanisms_handle_local;
  AMQP_VALUE value_local;
  
  ppSStack_18 = sasl_mechanisms_handle;
  sasl_mechanisms_handle_local = (SASL_MECHANISMS_HANDLE *)value;
  list_value = (AMQP_VALUE)sasl_mechanisms_create_internal();
  *ppSStack_18 = (SASL_MECHANISMS_HANDLE)list_value;
  if (*ppSStack_18 == (SASL_MECHANISMS_HANDLE)0x0) {
    sasl_mechanisms_instance._4_4_ = 0x27ff;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)sasl_mechanisms_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      sasl_mechanisms_destroy(*ppSStack_18);
      sasl_mechanisms_instance._4_4_ = 0x2807;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          sasl_mechanisms_instance._4_4_ = 0x283d;
        }
        else {
          sasl_server_mechanisms = (char *)amqpvalue_get_list_item(pAStack_30,0);
          if ((AMQP_VALUE)sasl_server_mechanisms == (AMQP_VALUE)0x0) {
            sasl_mechanisms_destroy(*ppSStack_18);
            sasl_mechanisms_instance._4_4_ = 0x281d;
          }
          else {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)sasl_server_mechanisms);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy((AMQP_VALUE)sasl_server_mechanisms);
              sasl_mechanisms_destroy(*ppSStack_18);
              sasl_mechanisms_instance._4_4_ = 0x2827;
            }
            else {
              sasl_server_mechanisms_array = (AMQP_VALUE)0x0;
              AVar2 = amqpvalue_get_type((AMQP_VALUE)sasl_server_mechanisms);
              if (((AVar2 == AMQP_TYPE_ARRAY) &&
                  (iVar1 = amqpvalue_get_array((AMQP_VALUE)sasl_server_mechanisms,&local_50),
                  iVar1 == 0)) ||
                 (iVar1 = amqpvalue_get_symbol
                                    ((AMQP_VALUE)sasl_server_mechanisms,
                                     (char **)&sasl_server_mechanisms_array), iVar1 == 0)) {
                amqpvalue_destroy((AMQP_VALUE)sasl_server_mechanisms);
                pAVar3 = amqpvalue_clone((AMQP_VALUE)sasl_mechanisms_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                sasl_mechanisms_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy((AMQP_VALUE)sasl_server_mechanisms);
                sasl_mechanisms_destroy(*ppSStack_18);
                sasl_mechanisms_instance._4_4_ = 0x2833;
              }
            }
          }
        }
      }
      else {
        sasl_mechanisms_instance._4_4_ = 0x280e;
      }
    }
  }
  return sasl_mechanisms_instance._4_4_;
}

Assistant:

int amqpvalue_get_sasl_mechanisms(AMQP_VALUE value, SASL_MECHANISMS_HANDLE* sasl_mechanisms_handle)
{
    int result;
    SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms_create_internal();
    *sasl_mechanisms_handle = sasl_mechanisms_instance;
    if (*sasl_mechanisms_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_mechanisms_destroy(*sasl_mechanisms_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* sasl-server-mechanisms */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_mechanisms_destroy(*sasl_mechanisms_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_mechanisms_destroy(*sasl_mechanisms_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* sasl_server_mechanisms = NULL;
                                AMQP_VALUE sasl_server_mechanisms_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &sasl_server_mechanisms_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &sasl_server_mechanisms) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_mechanisms_destroy(*sasl_mechanisms_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }

                    sasl_mechanisms_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}